

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  int i;
  int local_2c;
  int idx;
  int v;
  int base_local;
  expdesc *var_local;
  TString *n_local;
  FuncState *fs_local;
  
  if (fs == (FuncState *)0x0) {
    init_exp(var,VVOID,0);
  }
  else {
    i = searchvar(fs,n);
    if (i < 0) {
      local_2c = searchupvalue(fs,n);
      if (local_2c < 0) {
        singlevaraux(fs->prev,n,var,0);
        if (var->k == VVOID) {
          return;
        }
        local_2c = newupvalue(fs,n,var);
      }
      init_exp(var,VUPVAL,local_2c);
    }
    else {
      init_exp(var,VLOCAL,i);
      if (base == 0) {
        markupval(fs,i);
      }
    }
  }
  return;
}

Assistant:

static void singlevaraux(FuncState *fs, TString *n, expdesc *var, int base) {
    if (fs == NULL)  /* no more levels? */
        init_exp(var, VVOID, 0);  /* default is global */
    else {
        int v = searchvar(fs, n);  /* look up locals at current level */
        if (v >= 0) {  /* found? */
            init_exp(var, VLOCAL, v);  /* variable is local */
            if (!base)
                markupval(fs, v);  /* local will be used as an upval */
        } else {  /* not found as local at current level; try upvalues */
            int idx = searchupvalue(fs, n);  /* try existing upvalues */
            if (idx < 0) {  /* not found? */
                singlevaraux(fs->prev, n, var, 0);  /* try upper levels */
                if (var->k == VVOID)  /* not found? */
                    return;  /* it is a global */
                /* else was LOCAL or UPVAL */
                idx = newupvalue(fs, n, var);  /* will be a new upvalue */
            }
            init_exp(var, VUPVAL, idx);  /* new or old upvalue */
        }
    }
}